

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O0

void __thiscall QPrinter::setOutputFormat(QPrinter *this,OutputFormat format)

{
  long lVar1;
  bool bVar2;
  QPrinterPrivate *this_00;
  OutputFormat in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPrinterPrivate *d;
  QPrinterInfo printerToUse;
  QPrinterInfo *in_stack_ffffffffffffffb0;
  QPrinterPrivate *this_01;
  undefined4 in_stack_ffffffffffffffd0;
  OutputFormat format_00;
  QPrinterPrivate *in_stack_ffffffffffffffe0;
  
  format_00 = (OutputFormat)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPrinter *)0x143f69);
  if (this_00->outputFormat != in_ESI) {
    if (in_ESI == NativeFormat) {
      this_01 = this_00;
      QPrinterInfo::QPrinterInfo(in_stack_ffffffffffffffb0);
      QPrinterPrivate::findValidPrinter(this_01,(QPrinterInfo *)this_00);
      QPrinterInfo::~QPrinterInfo((QPrinterInfo *)0x143fc6);
      bVar2 = QPrinterInfo::isNull((QPrinterInfo *)this_00);
      if (!bVar2) {
        QPrinterPrivate::changeEngines
                  (in_stack_ffffffffffffffe0,format_00,
                   (QPrinterInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
      }
      QPrinterInfo::~QPrinterInfo((QPrinterInfo *)0x143ff1);
    }
    else {
      QPrinterInfo::QPrinterInfo((QPrinterInfo *)this_00);
      QPrinterPrivate::changeEngines
                (in_stack_ffffffffffffffe0,format_00,
                 (QPrinterInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
      QPrinterInfo::~QPrinterInfo((QPrinterInfo *)0x14402c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrinter::setOutputFormat(OutputFormat format)
{
    Q_D(QPrinter);

    if (d->outputFormat == format)
        return;

    if (format == QPrinter::NativeFormat) {
        QPrinterInfo printerToUse = d->findValidPrinter();
        if (!printerToUse.isNull())
            d->changeEngines(format, printerToUse);
    } else {
        d->changeEngines(format, QPrinterInfo());
    }
}